

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O2

ZSTD_DDict * duckdb_zstd::ZSTD_getDDict(ZSTD_DCtx *dctx)

{
  if (dctx->dictUses != ZSTD_use_indefinitely) {
    if (dctx->dictUses != ZSTD_use_once) {
      ZSTD_clearDict(dctx);
      return (ZSTD_DDict *)0x0;
    }
    dctx->dictUses = ZSTD_dont_use;
  }
  return dctx->ddict;
}

Assistant:

static ZSTD_DDict const* ZSTD_getDDict(ZSTD_DCtx* dctx)
{
    switch (dctx->dictUses) {
    default:
        assert(0 /* Impossible */);
        ZSTD_FALLTHROUGH;
    case ZSTD_dont_use:
        ZSTD_clearDict(dctx);
        return NULL;
    case ZSTD_use_indefinitely:
        return dctx->ddict;
    case ZSTD_use_once:
        dctx->dictUses = ZSTD_dont_use;
        return dctx->ddict;
    }
}